

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp analyze_if(sexp ctx,sexp x,int depth)

{
  undefined8 in_RSI;
  undefined8 in_RDI;
  sexp unaff_retaddr;
  int in_stack_00000010;
  int in_stack_00000014;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp fail;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp pass;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp test;
  sexp fail_expr;
  sexp res;
  sexp in_stack_ffffffffffffff78;
  sexp in_stack_ffffffffffffff80;
  sexp test_00;
  sexp ctx_00;
  sexp local_60;
  undefined1 local_58 [24];
  sexp_gc_var_t local_40;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  local_30 = &DAT_0000043e;
  memset(&local_40,0,0x10);
  local_58._16_8_ = 0x43e;
  memset(local_58,0,0x10);
  local_60 = (sexp)0x43e;
  memset(&stack0xffffffffffffff90,0,0x10);
  local_40.var = (sexp_conflict *)&stack0xffffffffffffffd0;
  local_40.next = (((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = &local_40;
  local_58._0_8_ = local_58 + 0x10;
  local_58._8_8_ = (((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)local_58;
  ctx_00 = (sexp)&local_60;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffff90;
  if ((((((((sexp)in_RSI)->value).string.offset & 3) == 0) &&
       (((((sexp)in_RSI)->value).type.cpl)->tag == 6)) &&
      (((((((sexp)in_RSI)->value).type.cpl)->value).string.offset & 3) == 0)) &&
     (((((((sexp)in_RSI)->value).type.cpl)->value).type.cpl)->tag == 6)) {
    if (((((((((((sexp)in_RSI)->value).type.cpl)->value).type.cpl)->value).string.offset & 3) == 0)
        && (((((((((sexp)in_RSI)->value).type.cpl)->value).type.cpl)->value).type.cpl)->tag == 6))
       && ((((((((((sexp)in_RSI)->value).type.cpl)->value).type.cpl)->value).type.cpl)->value).type.
           cpl != (sexp)0x23e)) {
      local_20 = sexp_compile_error(unaff_retaddr,(char *)in_RDI,(sexp)in_RSI);
    }
    else {
      local_30 = analyze((sexp)__sexp_gc_preserver3.next,(sexp)__sexp_gc_preserver3.var,
                         in_stack_00000014,in_stack_00000010);
      if ((((local_30 & 3) != 0) || (local_20 = local_30, ((sexp)local_30)->tag != 0x13)) &&
         ((local_58._16_8_ =
                analyze((sexp)__sexp_gc_preserver3.next,(sexp)__sexp_gc_preserver3.var,
                        in_stack_00000014,in_stack_00000010), (local_58._16_8_ & 3) != 0 ||
          (local_20 = local_58._16_8_, ((sexp)local_58._16_8_)->tag != 0x13)))) {
        if ((((((((((sexp)in_RSI)->value).type.cpl)->value).type.cpl)->value).string.offset & 3) ==
             0) && (((((((((sexp)in_RSI)->value).type.cpl)->value).type.cpl)->value).type.cpl)->tag
                    == 6)) {
          test_00 = (((((((((sexp)in_RSI)->value).type.cpl)->value).type.cpl)->value).type.cpl)->
                    value).type.name;
        }
        else {
          test_00 = (sexp)&DAT_0000043e;
        }
        local_28 = test_00;
        local_60 = analyze((sexp)__sexp_gc_preserver3.next,(sexp)__sexp_gc_preserver3.var,
                           in_stack_00000014,in_stack_00000010);
        if ((((ulong)local_60 & 3) != 0) || (local_20 = local_60, local_60->tag != 0x13)) {
          local_20 = sexp_make_cnd(ctx_00,test_00,in_stack_ffffffffffffff80,
                                   in_stack_ffffffffffffff78);
        }
      }
      if (((local_20 & 3) == 0) && (((sexp)local_20)->tag == 0x1d)) {
        (((sexp)local_20)->value).type.getters = (((sexp)in_RSI)->value).type.slots;
      }
    }
  }
  else {
    local_20 = sexp_compile_error(unaff_retaddr,(char *)in_RDI,(sexp)in_RSI);
  }
  (((sexp)in_RDI)->value).context.saves = local_40.next;
  return (sexp)local_20;
}

Assistant:

static sexp analyze_if (sexp ctx, sexp x, int depth) {
  sexp res, fail_expr;
  sexp_gc_var3(test, pass, fail);
  sexp_gc_preserve3(ctx, test, pass, fail);
  if (! (sexp_pairp(sexp_cdr(x)) && sexp_pairp(sexp_cddr(x)))) {
    res = sexp_compile_error(ctx, "not enough args to if", x);
  } else if (sexp_pairp(sexp_cdddr(x)) && sexp_cdr(sexp_cdddr(x)) != SEXP_NULL) {
    res = sexp_compile_error(ctx, "too many args to if", x);
  } else {
    test = analyze(ctx, sexp_cadr(x), depth, 0);
    if (sexp_exceptionp(test)) {
      res = test;
    } else {
      pass = analyze(ctx, sexp_caddr(x), depth, 0);
      if (sexp_exceptionp(pass)) {
        res = pass;
      } else {
        fail_expr = sexp_pairp(sexp_cdddr(x)) ? sexp_cadddr(x) : SEXP_VOID;
        fail = analyze(ctx, fail_expr, depth, 0);
        res = sexp_exceptionp(fail) ? fail : sexp_make_cnd(ctx, test, pass, fail);
      }
    }
    if (sexp_cndp(res)) sexp_cnd_source(res) = sexp_pair_source(x);
  }
  sexp_gc_release3(ctx);
  return res;
}